

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixLookAt(Matrix *__return_storage_ptr__,Vector3 eye,Vector3 target,Vector3 up)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector3 VVar4;
  Vector3 VVar5;
  Vector3 VVar6;
  float local_58;
  float fStack_54;
  float local_38;
  float fStack_34;
  
  fVar3 = eye.z;
  fVar1 = eye.x;
  fVar2 = eye.y;
  VVar4.x = fVar1 - target.x;
  VVar4.y = fVar2 - target.y;
  VVar4.z = fVar3 - target.z;
  VVar4 = Vector3Normalize(VVar4);
  VVar5 = Vector3CrossProduct(up,VVar4);
  VVar5 = Vector3Normalize(VVar5);
  VVar6 = Vector3CrossProduct(VVar4,VVar5);
  local_58 = VVar5.x;
  fStack_54 = VVar5.y;
  __return_storage_ptr__->m0 = local_58;
  __return_storage_ptr__->m4 = fStack_54;
  __return_storage_ptr__->m1 = (float)(int)VVar6._0_8_;
  __return_storage_ptr__->m5 = (float)(int)((ulong)VVar6._0_8_ >> 0x20);
  local_38 = VVar4.x;
  fStack_34 = VVar4.y;
  __return_storage_ptr__->m2 = local_38;
  __return_storage_ptr__->m6 = fStack_34;
  __return_storage_ptr__->m8 = VVar5.z;
  __return_storage_ptr__->m9 = VVar6.z;
  __return_storage_ptr__->m10 = VVar4.z;
  __return_storage_ptr__->m12 = -(VVar5.z * fVar3 + local_58 * fVar1 + fStack_54 * fVar2);
  __return_storage_ptr__->m13 = -(VVar6.z * fVar3 + VVar6.x * fVar1 + VVar6.y * fVar2);
  __return_storage_ptr__->m14 = -(VVar4.z * fVar3 + local_38 * fVar1 + fStack_34 * fVar2);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixLookAt(Vector3 eye, Vector3 target, Vector3 up)
{
    Matrix result = { 0 };

    Vector3 z = Vector3Subtract(eye, target);
    z = Vector3Normalize(z);
    Vector3 x = Vector3CrossProduct(up, z);
    x = Vector3Normalize(x);
    Vector3 y = Vector3CrossProduct(z, x);

    result.m0 = x.x;
    result.m1 = y.x;
    result.m2 = z.x;
    result.m3 = 0.0f;
    result.m4 = x.y;
    result.m5 = y.y;
    result.m6 = z.y;
    result.m7 = 0.0f;
    result.m8 = x.z;
    result.m9 = y.z;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = -Vector3DotProduct(x, eye);
    result.m13 = -Vector3DotProduct(y, eye);
    result.m14 = -Vector3DotProduct(z, eye);
    result.m15 = 1.0f;

    return result;
}